

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

void scale_references_fpmt(AV1_COMP *cpi,int *ref_buffers_used_map)

{
  byte bVar1;
  BufferPool *pBVar2;
  YV12_BUFFER_CONFIG *pYVar3;
  RefCntBuffer *pRVar4;
  int i;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = 1;
  do {
    if (lVar7 == 8) {
      return;
    }
    if ((cpi->ref_frame_flags & (uint)""[lVar7]) == 0) {
      if (((cpi->oxcf).pass != AOM_RC_ONE_PASS) || (cpi->ppi->lap_enabled != 0)) goto LAB_001a114a;
    }
    else {
      pYVar3 = get_ref_frame_yv12_buf(&cpi->common,(MV_REFERENCE_FRAME)lVar7);
      if (pYVar3 == (YV12_BUFFER_CONFIG *)0x0) {
LAB_001a114a:
        *(undefined8 *)((long)cpi->scaled_ref_buf + ((lVar7 << 0x20) + -0x100000000 >> 0x1d)) = 0;
      }
      else {
        pRVar4 = get_ref_frame_buf(&cpi->common,(MV_REFERENCE_FRAME)lVar7);
        *(RefCntBuffer **)((long)cpi->scaled_ref_buf + ((lVar7 << 0x20) + -0x100000000 >> 0x1d)) =
             pRVar4;
        pBVar2 = (cpi->common).buffer_pool;
        bVar1 = pBVar2->num_frame_bufs;
        lVar6 = 0;
        for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
          if ((RefCntBuffer *)((long)pBVar2->frame_bufs->ref_order_hints + lVar6 + -8) == pRVar4) {
            *ref_buffers_used_map = *ref_buffers_used_map | 1 << ((byte)uVar5 & 0x1f);
          }
          lVar6 = lVar6 + 0x58e0;
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static void scale_references_fpmt(AV1_COMP *cpi, int *ref_buffers_used_map) {
  AV1_COMMON *cm = &cpi->common;
  MV_REFERENCE_FRAME ref_frame;

  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    // Need to convert from AOM_REFFRAME to index into ref_mask (subtract 1).
    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      const YV12_BUFFER_CONFIG *const ref =
          get_ref_frame_yv12_buf(cm, ref_frame);

      if (ref == NULL) {
        cpi->scaled_ref_buf[ref_frame - 1] = NULL;
        continue;
      }

      // FPMT does not support scaling yet.
      assert(ref->y_crop_width == cm->width &&
             ref->y_crop_height == cm->height);

      RefCntBuffer *buf = get_ref_frame_buf(cm, ref_frame);
      cpi->scaled_ref_buf[ref_frame - 1] = buf;
      for (int i = 0; i < cm->buffer_pool->num_frame_bufs; ++i) {
        if (&cm->buffer_pool->frame_bufs[i] == buf) {
          *ref_buffers_used_map |= (1 << i);
        }
      }
    } else {
      if (!has_no_stats_stage(cpi)) cpi->scaled_ref_buf[ref_frame - 1] = NULL;
    }
  }
}